

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void tf_motion_search(AV1_COMP *cpi,MACROBLOCK *mb,YV12_BUFFER_CONFIG *frame_to_filter,
                     YV12_BUFFER_CONFIG *ref_frame,BLOCK_SIZE block_size,int mb_row,int mb_col,
                     MV *ref_mv,_Bool allow_me_for_sub_blks,MV *subblock_mvs,int *subblock_mses,
                     int *is_dc_diff_large)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  MV MVar21;
  int fine_search_interval;
  uint uVar22;
  int iVar23;
  MV *in_RCX;
  int *in_RDX;
  MACROBLOCK *in_RSI;
  AV1_COMP *in_RDI;
  byte in_R8B;
  int in_R9D;
  int in_stack_00000008;
  MV *in_stack_00000010;
  byte in_stack_00000018;
  MV *in_stack_00000020;
  int *in_stack_00000028;
  uint *in_stack_00000030;
  int thresh;
  int i_1;
  int offset;
  int j;
  int i;
  int subblock_idx;
  int subblock_pels;
  int subblock_width;
  int subblock_height;
  BLOCK_SIZE subblock_size;
  MV subpel_start_mv;
  int mv_offset;
  int mv_col;
  int mv_row;
  int q;
  MV block_mv;
  int block_mse;
  FULLPEL_MV_STATS best_mv_stats;
  int_mv best_mv;
  int cost_list [5];
  int distortion;
  uint error;
  uint sse;
  search_site_config *search_site_cfg;
  SEARCH_METHODS search_method;
  MV baseline_mv;
  FULLPEL_MV start_mv;
  MV_COST_TYPE mv_cost_type;
  int force_integer_mv;
  SUBPEL_SEARCH_TYPE subpel_search_type;
  int step_param;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  buf_2d ori_pre_buf;
  buf_2d ori_src_buf;
  MACROBLOCKD *mbd;
  int y_offset;
  int ref_width;
  int src_width;
  int y_stride;
  int mb_pels;
  int mb_width;
  int mb_height;
  int min_frame_size;
  undefined8 in_stack_fffffffffffffce8;
  SEARCH_METHODS search_method_00;
  AV1_COMP *in_stack_fffffffffffffcf0;
  AV1_COMP *in_stack_fffffffffffffcf8;
  undefined1 local_2ec;
  int size;
  int iVar24;
  int iVar25;
  MV *ref_mv_00;
  int *piVar26;
  MACROBLOCK *x;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  int iVar27;
  MV in_stack_fffffffffffffd44;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 uVar28;
  int in_stack_fffffffffffffd88;
  int iVar29;
  uint in_stack_fffffffffffffd8c;
  short sVar30;
  MV in_stack_fffffffffffffd94;
  short sVar31;
  MV start_mv_00;
  int local_268 [2];
  search_site_config *in_stack_fffffffffffffda0;
  SEARCH_METHODS in_stack_fffffffffffffda8;
  int local_254;
  int in_stack_fffffffffffffdb0;
  uint local_24c;
  search_site_config *local_248;
  undefined1 local_23f;
  undefined1 local_23e [4];
  FULLPEL_MV local_23a;
  undefined1 local_235;
  uint local_234;
  undefined1 local_22d;
  int local_22c;
  SUBPEL_FORCE_STOP local_218;
  MV_COST_TYPE local_1f4;
  SUBPEL_SEARCH_TYPE local_1c8;
  FULLPEL_MV_STATS *in_stack_fffffffffffffe58;
  FULLPEL_MV *in_stack_fffffffffffffe60;
  int *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe74;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffe78;
  FULLPEL_MV in_stack_fffffffffffffe80;
  FULLPEL_MV *in_stack_fffffffffffffe90;
  
  search_method_00 = (SEARCH_METHODS)((ulong)in_stack_fffffffffffffce8 >> 0x38);
  if ((in_RDI->common).width < (in_RDI->common).height) {
    iVar24 = (in_RDI->common).width;
  }
  else {
    iVar24 = (in_RDI->common).height;
  }
  uVar20 = (uint)block_size_high[in_R8B];
  uVar16 = (uint)block_size_wide[in_R8B];
  uVar17 = uVar20 * uVar16;
  iVar27 = in_RDX[8];
  iVar19 = *in_RDX;
  MVar21 = *in_RCX;
  iVar18 = in_R9D * uVar20 * iVar27 + in_stack_00000008 * uVar16;
  puVar4 = in_RSI->plane[0].src.buf;
  puVar5 = in_RSI->plane[0].src.buf0;
  iVar8 = in_RSI->plane[0].src.width;
  iVar9 = in_RSI->plane[0].src.height;
  iVar10 = in_RSI->plane[0].src.stride;
  uVar11 = *(undefined4 *)&in_RSI->plane[0].src.field_0x1c;
  puVar6 = (in_RSI->e_mbd).plane[0].pre[0].buf;
  puVar7 = (in_RSI->e_mbd).plane[0].pre[0].buf0;
  iVar12 = (in_RSI->e_mbd).plane[0].pre[0].width;
  iVar13 = (in_RSI->e_mbd).plane[0].pre[0].height;
  iVar14 = (in_RSI->e_mbd).plane[0].pre[0].stride;
  uVar15 = *(undefined4 *)&(in_RSI->e_mbd).plane[0].pre[0].field_0x1c;
  if (in_RDX[6] < in_RDX[4]) {
    size = in_RDX[4];
  }
  else {
    size = in_RDX[6];
  }
  iVar25 = iVar24;
  ref_mv_00 = in_RCX;
  piVar26 = in_RDX;
  x = in_RSI;
  local_22c = av1_init_search_range(size);
  local_22d = 3;
  local_234 = (uint)((in_RDI->common).features.cur_frame_force_integer_mv & 1);
  if (iVar24 < 0x2d0) {
    local_2ec = 1;
    if (0x1df < iVar24) {
      local_2ec = 2;
    }
  }
  else {
    local_2ec = 3;
  }
  local_235 = local_2ec;
  local_23a = get_fullmv_from_mv(in_stack_00000010);
  memset(local_23e,0,4);
  in_RSI->plane[0].src.buf = (uint8_t *)(*(long *)(in_RDX + 10) + (long)iVar18);
  in_RSI->plane[0].src.stride = iVar27;
  in_RSI->plane[0].src.width = iVar19;
  (in_RSI->e_mbd).plane[0].pre[0].buf = (uint8_t *)(*(long *)(in_RCX + 10) + (long)iVar18);
  (in_RSI->e_mbd).plane[0].pre[0].stride = iVar27;
  (in_RSI->e_mbd).plane[0].pre[0].width = (int)MVar21;
  (in_RSI->e_mbd).mi_row = in_R9D * (block_size_high[in_R8B] / 4);
  (in_RSI->e_mbd).mi_col = in_stack_00000008 * (block_size_wide[in_R8B] / 4);
  *in_stack_00000030 = 0;
  local_23f = 1;
  local_248 = av1_get_search_site_config
                        (in_stack_fffffffffffffcf8,(MACROBLOCK *)in_stack_fffffffffffffcf0,
                         search_method_00);
  uVar28 = 0x7fffffff;
  memset(&stack0xfffffffffffffd80,0,4);
  iVar19 = get_q(in_stack_fffffffffffffcf0);
  av1_make_default_fullpel_ms_params
            ((FULLPEL_MOTION_SEARCH_PARAMS *)
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             (AV1_COMP *)CONCAT44(uVar28,in_stack_fffffffffffffd80),
             (MACROBLOCK *)CONCAT44(iVar19,in_stack_fffffffffffffd78),
             (BLOCK_SIZE)((uint)in_stack_fffffffffffffd74 >> 0x18),
             (MV *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             (FULLPEL_MV)in_stack_fffffffffffffd94,in_stack_fffffffffffffda0,
             in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
  cond_cost_list(in_RDI,local_268);
  av1_full_pixel_search
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
             in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe90);
  if (local_234 == 1) {
    sVar30 = in_stack_fffffffffffffd94.row;
    sVar31 = in_stack_fffffffffffffd94.col;
    in_stack_fffffffffffffd94.col = (int16_t)((int)sVar31 << 3);
    in_stack_fffffffffffffd94.row = (int16_t)((int)sVar30 << 3);
    uVar20 = (*in_RDI->ppi->fn_ptr[in_R8B].vf)
                       ((uint8_t *)
                        (*(long *)(in_RCX + 10) + (long)iVar18 +
                        (long)(sVar30 * iVar27 + (int)sVar31)),iVar27,
                        (uint8_t *)(*(long *)(in_RDX + 10) + (long)iVar18),iVar27,&local_24c);
    uVar17 = (uVar20 + ((int)uVar17 >> 1)) / uVar17;
  }
  else {
    av1_make_default_subpel_ms_params
              ((SUBPEL_MOTION_SEARCH_PARAMS *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               (AV1_COMP *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),x,
               (BLOCK_SIZE)((ulong)piVar26 >> 0x38),ref_mv_00,(int *)CONCAT44(iVar25,size));
    local_218 = '\0';
    local_1c8 = '\x03';
    local_1f4 = '\x04';
    iVar29 = 0;
    MVar21 = get_mv_from_fullmv((FULLPEL_MV *)&stack0xfffffffffffffd94);
    fine_search_interval =
         (*(in_RDI->mv_search_params).find_fractional_mv_step)
                   (&in_RSI->e_mbd,&in_RDI->common,
                    (SUBPEL_MOTION_SEARCH_PARAMS *)&stack0xfffffffffffffdd8,MVar21,
                    (FULLPEL_MV_STATS *)&stack0xfffffffffffffd88,(MV *)&stack0xfffffffffffffd94,
                    &local_254,&local_24c,(int_mv *)0x0);
    uVar17 = (uint)(fine_search_interval + ((int)uVar17 >> 1)) / uVar17;
    *in_stack_00000010 = in_stack_fffffffffffffd94;
    *in_stack_00000030 = (uint)((uint)(fine_search_interval * 0x32) < local_24c);
    if ((in_stack_00000018 & 1) != 0) {
      BVar1 = av1_ss_size_lookup[in_R8B][1][1];
      uVar28 = CONCAT13(BVar1,(int3)in_stack_fffffffffffffd68);
      bVar2 = block_size_high[BVar1];
      bVar3 = block_size_wide[BVar1];
      uVar22 = (uint)bVar2 * (uint)bVar3;
      start_mv_00 = in_stack_fffffffffffffd94;
      local_23a = get_fullmv_from_mv(in_stack_00000010);
      local_2ac = 0;
      for (local_2b0 = 0; local_2b0 < (int)uVar20; local_2b0 = (uint)bVar2 + local_2b0) {
        for (local_2b4 = 0; local_2b4 < (int)uVar16; local_2b4 = (uint)bVar3 + local_2b4) {
          iVar23 = local_2b0 * iVar27 + local_2b4;
          in_RSI->plane[0].src.buf =
               (uint8_t *)(*(long *)(in_RDX + 10) + (long)iVar18 + (long)iVar23);
          (in_RSI->e_mbd).plane[0].pre[0].buf =
               (uint8_t *)(*(long *)(in_RCX + 10) + (long)iVar18 + (long)iVar23);
          av1_make_default_fullpel_ms_params
                    ((FULLPEL_MOTION_SEARCH_PARAMS *)CONCAT44(in_stack_fffffffffffffd8c,iVar29),
                     (AV1_COMP *)CONCAT44(uVar17,in_stack_fffffffffffffd94),
                     (MACROBLOCK *)CONCAT44(iVar19,in_stack_fffffffffffffd78),
                     (BLOCK_SIZE)((uint)in_stack_fffffffffffffd74 >> 0x18),
                     (MV *)CONCAT44(MVar21,uVar28),(FULLPEL_MV)start_mv_00,in_stack_fffffffffffffda0
                     ,in_stack_fffffffffffffda8,fine_search_interval);
          cond_cost_list(in_RDI,local_268);
          av1_full_pixel_search
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                     in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                     in_stack_fffffffffffffe90);
          av1_make_default_subpel_ms_params
                    ((SUBPEL_MOTION_SEARCH_PARAMS *)
                     CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     (AV1_COMP *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),x,
                     (BLOCK_SIZE)((ulong)piVar26 >> 0x38),ref_mv_00,(int *)CONCAT44(iVar25,size));
          local_218 = '\0';
          local_1c8 = '\x03';
          local_1f4 = '\x04';
          iVar29 = 0;
          in_stack_fffffffffffffd44 = get_mv_from_fullmv((FULLPEL_MV *)&stack0xfffffffffffffd94);
          MVar21 = in_stack_fffffffffffffd44;
          fine_search_interval =
               (*(in_RDI->mv_search_params).find_fractional_mv_step)
                         (&in_RSI->e_mbd,&in_RDI->common,
                          (SUBPEL_MOTION_SEARCH_PARAMS *)&stack0xfffffffffffffdd8,
                          in_stack_fffffffffffffd44,(FULLPEL_MV_STATS *)&stack0xfffffffffffffd88,
                          (MV *)&stack0xfffffffffffffd94,&local_254,&local_24c,(int_mv *)0x0);
          in_stack_00000028[local_2ac] = (uint)(fine_search_interval + ((int)uVar22 >> 1)) / uVar22;
          in_stack_00000020[local_2ac] = start_mv_00;
          local_2ac = local_2ac + 1;
        }
      }
    }
  }
  in_RSI->plane[0].src.buf = puVar4;
  in_RSI->plane[0].src.buf0 = puVar5;
  in_RSI->plane[0].src.width = iVar8;
  in_RSI->plane[0].src.height = iVar9;
  in_RSI->plane[0].src.stride = iVar10;
  *(undefined4 *)&in_RSI->plane[0].src.field_0x1c = uVar11;
  (in_RSI->e_mbd).plane[0].pre[0].buf = puVar6;
  (in_RSI->e_mbd).plane[0].pre[0].buf0 = puVar7;
  (in_RSI->e_mbd).plane[0].pre[0].width = iVar12;
  (in_RSI->e_mbd).plane[0].pre[0].height = iVar13;
  (in_RSI->e_mbd).plane[0].pre[0].stride = iVar14;
  *(undefined4 *)&(in_RSI->e_mbd).plane[0].pre[0].field_0x1c = uVar15;
  if ((in_stack_00000018 & 1) == 0) {
    for (iVar27 = 0; iVar27 < 4; iVar27 = iVar27 + 1) {
      in_stack_00000020[iVar27] = in_stack_fffffffffffffd94;
      in_stack_00000028[iVar27] = uVar17;
    }
  }
  else {
    tf_determine_block_partition
              (in_stack_fffffffffffffd94,uVar17,in_stack_00000020,in_stack_00000028);
  }
  iVar27 = 3;
  if (0x2cf < iVar24) {
    iVar27 = 0xc;
  }
  if (iVar27 << ((char)(in_RSI->e_mbd).bd - 8U & 0x1f) < (int)uVar17) {
    in_stack_00000010->row = 0;
    in_stack_00000010->col = 0;
  }
  return;
}

Assistant:

static void tf_motion_search(AV1_COMP *cpi, MACROBLOCK *mb,
                             const YV12_BUFFER_CONFIG *frame_to_filter,
                             const YV12_BUFFER_CONFIG *ref_frame,
                             const BLOCK_SIZE block_size, const int mb_row,
                             const int mb_col, MV *ref_mv,
                             bool allow_me_for_sub_blks, MV *subblock_mvs,
                             int *subblock_mses, int *is_dc_diff_large) {
  // Frame information
  const int min_frame_size = AOMMIN(cpi->common.width, cpi->common.height);

  // Block information (ONLY Y-plane is used for motion search).
  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int mb_pels = mb_height * mb_width;
  const int y_stride = frame_to_filter->y_stride;
  const int src_width = frame_to_filter->y_width;
  const int ref_width = ref_frame->y_width;
  assert(y_stride == ref_frame->y_stride);
  assert(src_width == ref_width);
  const int y_offset = mb_row * mb_height * y_stride + mb_col * mb_width;

  // Save input state.
  MACROBLOCKD *const mbd = &mb->e_mbd;
  const struct buf_2d ori_src_buf = mb->plane[0].src;
  const struct buf_2d ori_pre_buf = mbd->plane[0].pre[0];

  // Parameters used for motion search.
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  const int step_param = av1_init_search_range(
      AOMMAX(frame_to_filter->y_crop_width, frame_to_filter->y_crop_height));
  const SUBPEL_SEARCH_TYPE subpel_search_type = USE_8_TAPS;
  const int force_integer_mv = cpi->common.features.cur_frame_force_integer_mv;
  const MV_COST_TYPE mv_cost_type =
      min_frame_size >= 720
          ? MV_COST_L1_HDRES
          : (min_frame_size >= 480 ? MV_COST_L1_MIDRES : MV_COST_L1_LOWRES);

  // Starting position for motion search.
  FULLPEL_MV start_mv = get_fullmv_from_mv(ref_mv);
  // Baseline position for motion search (used for rate distortion comparison).
  const MV baseline_mv = kZeroMv;

  // Setup.
  mb->plane[0].src.buf = frame_to_filter->y_buffer + y_offset;
  mb->plane[0].src.stride = y_stride;
  mb->plane[0].src.width = src_width;
  mbd->plane[0].pre[0].buf = ref_frame->y_buffer + y_offset;
  mbd->plane[0].pre[0].stride = y_stride;
  mbd->plane[0].pre[0].width = ref_width;
  mbd->mi_row =
      mb_row * (block_size_high[block_size] / block_size_high[BLOCK_4X4]);
  mbd->mi_col =
      mb_col * (block_size_wide[block_size] / block_size_wide[BLOCK_4X4]);
  *is_dc_diff_large = 0;

  const SEARCH_METHODS search_method = NSTEP;
  const search_site_config *search_site_cfg =
      av1_get_search_site_config(cpi, mb, search_method);

  // Unused intermediate results for motion search.
  unsigned int sse, error;
  int distortion;
  int cost_list[5];

  // Do motion search.
  int_mv best_mv;  // Searched motion vector.
  FULLPEL_MV_STATS best_mv_stats;
  int block_mse = INT_MAX;
  MV block_mv = kZeroMv;
  const int q = get_q(cpi);

  av1_make_default_fullpel_ms_params(&full_ms_params, cpi, mb, block_size,
                                     &baseline_mv, start_mv, search_site_cfg,
                                     search_method,
                                     /*fine_search_interval=*/0);
  full_ms_params.run_mesh_search = 1;
  full_ms_params.mv_cost_params.mv_cost_type = mv_cost_type;

  if (cpi->sf.mv_sf.prune_mesh_search == PRUNE_MESH_SEARCH_LVL_1) {
    // Enable prune_mesh_search based on q for PRUNE_MESH_SEARCH_LVL_1.
    full_ms_params.prune_mesh_search = (q <= 20) ? 0 : 1;
    full_ms_params.mesh_search_mv_diff_threshold = 2;
  }

  av1_full_pixel_search(start_mv, &full_ms_params, step_param,
                        cond_cost_list(cpi, cost_list), &best_mv.as_fullmv,
                        &best_mv_stats, NULL);

  if (force_integer_mv == 1) {  // Only do full search on the entire block.
    const int mv_row = best_mv.as_mv.row;
    const int mv_col = best_mv.as_mv.col;
    best_mv.as_mv.row = GET_MV_SUBPEL(mv_row);
    best_mv.as_mv.col = GET_MV_SUBPEL(mv_col);
    const int mv_offset = mv_row * y_stride + mv_col;
    error = cpi->ppi->fn_ptr[block_size].vf(
        ref_frame->y_buffer + y_offset + mv_offset, y_stride,
        frame_to_filter->y_buffer + y_offset, y_stride, &sse);
    block_mse = DIVIDE_AND_ROUND(error, mb_pels);
    block_mv = best_mv.as_mv;
  } else {  // Do fractional search on the entire block and all sub-blocks.
    av1_make_default_subpel_ms_params(&ms_params, cpi, mb, block_size,
                                      &baseline_mv, cost_list);
    ms_params.forced_stop = EIGHTH_PEL;
    ms_params.var_params.subpel_search_type = subpel_search_type;
    // Since we are merely refining the result from full pixel search, we don't
    // need regularization for subpel search
    ms_params.mv_cost_params.mv_cost_type = MV_COST_NONE;
    best_mv_stats.err_cost = 0;

    MV subpel_start_mv = get_mv_from_fullmv(&best_mv.as_fullmv);
    assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv));
    error = cpi->mv_search_params.find_fractional_mv_step(
        &mb->e_mbd, &cpi->common, &ms_params, subpel_start_mv, &best_mv_stats,
        &best_mv.as_mv, &distortion, &sse, NULL);
    block_mse = DIVIDE_AND_ROUND(error, mb_pels);
    block_mv = best_mv.as_mv;
    *ref_mv = best_mv.as_mv;
    *is_dc_diff_large = 50 * error < sse;

    if (allow_me_for_sub_blks) {
      // On 4 sub-blocks.
      const BLOCK_SIZE subblock_size = av1_ss_size_lookup[block_size][1][1];
      const int subblock_height = block_size_high[subblock_size];
      const int subblock_width = block_size_wide[subblock_size];
      const int subblock_pels = subblock_height * subblock_width;
      start_mv = get_fullmv_from_mv(ref_mv);

      int subblock_idx = 0;
      for (int i = 0; i < mb_height; i += subblock_height) {
        for (int j = 0; j < mb_width; j += subblock_width) {
          const int offset = i * y_stride + j;
          mb->plane[0].src.buf = frame_to_filter->y_buffer + y_offset + offset;
          mbd->plane[0].pre[0].buf = ref_frame->y_buffer + y_offset + offset;
          av1_make_default_fullpel_ms_params(
              &full_ms_params, cpi, mb, subblock_size, &baseline_mv, start_mv,
              search_site_cfg, search_method,
              /*fine_search_interval=*/0);
          full_ms_params.run_mesh_search = 1;
          full_ms_params.mv_cost_params.mv_cost_type = mv_cost_type;

          if (cpi->sf.mv_sf.prune_mesh_search == PRUNE_MESH_SEARCH_LVL_1) {
            // Enable prune_mesh_search based on q for PRUNE_MESH_SEARCH_LVL_1.
            full_ms_params.prune_mesh_search = (q <= 20) ? 0 : 1;
            full_ms_params.mesh_search_mv_diff_threshold = 2;
          }
          av1_full_pixel_search(start_mv, &full_ms_params, step_param,
                                cond_cost_list(cpi, cost_list),
                                &best_mv.as_fullmv, &best_mv_stats, NULL);

          av1_make_default_subpel_ms_params(&ms_params, cpi, mb, subblock_size,
                                            &baseline_mv, cost_list);
          ms_params.forced_stop = EIGHTH_PEL;
          ms_params.var_params.subpel_search_type = subpel_search_type;
          // Since we are merely refining the result from full pixel search, we
          // don't need regularization for subpel search
          ms_params.mv_cost_params.mv_cost_type = MV_COST_NONE;
          best_mv_stats.err_cost = 0;

          subpel_start_mv = get_mv_from_fullmv(&best_mv.as_fullmv);
          assert(
              av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv));
          error = cpi->mv_search_params.find_fractional_mv_step(
              &mb->e_mbd, &cpi->common, &ms_params, subpel_start_mv,
              &best_mv_stats, &best_mv.as_mv, &distortion, &sse, NULL);
          subblock_mses[subblock_idx] = DIVIDE_AND_ROUND(error, subblock_pels);
          subblock_mvs[subblock_idx] = best_mv.as_mv;
          ++subblock_idx;
        }
      }
    }
  }

  // Restore input state.
  mb->plane[0].src = ori_src_buf;
  mbd->plane[0].pre[0] = ori_pre_buf;

  // Make partition decision.
  if (allow_me_for_sub_blks) {
    tf_determine_block_partition(block_mv, block_mse, subblock_mvs,
                                 subblock_mses);
  } else {
    // Copy 32X32 block mv and mse values to sub blocks
    for (int i = 0; i < 4; ++i) {
      subblock_mvs[i] = block_mv;
      subblock_mses[i] = block_mse;
    }
  }
  // Do not pass down the reference motion vector if error is too large.
  const int thresh = (min_frame_size >= 720) ? 12 : 3;
  if (block_mse > (thresh << (mbd->bd - 8))) {
    *ref_mv = kZeroMv;
  }
}